

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_expect_key_uint(mpack_reader_t *reader,_Bool *found,size_t count)

{
  mpack_error_t mVar1;
  mpack_reader_t *pmVar2;
  mpack_tag_t mVar3;
  uint64_t value;
  size_t count_local;
  _Bool *found_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_reader_error(reader);
  reader_local = (mpack_reader_t *)count;
  if (mVar1 == mpack_ok) {
    if (count == 0) {
      mpack_reader_flag_error(reader,mpack_error_bug);
      reader_local = (mpack_reader_t *)count;
    }
    else {
      mVar3 = mpack_peek_tag(reader);
      if (mVar3.type == mpack_type_uint) {
        pmVar2 = (mpack_reader_t *)mpack_expect_u64(reader);
        mVar1 = mpack_reader_error(reader);
        if ((mVar1 == mpack_ok) && (pmVar2 < count)) {
          if ((found[(long)pmVar2] & 1U) == 0) {
            found[(long)pmVar2] = true;
            reader_local = pmVar2;
          }
          else {
            mpack_reader_flag_error(reader,mpack_error_invalid);
            reader_local = (mpack_reader_t *)count;
          }
        }
      }
      else {
        mpack_discard(reader);
        reader_local = (mpack_reader_t *)count;
      }
    }
  }
  return (size_t)reader_local;
}

Assistant:

size_t mpack_expect_key_uint(mpack_reader_t* reader, bool found[], size_t count) {
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    if (count == 0) {
        mpack_break("count cannot be zero; no keys are valid!");
        mpack_reader_flag_error(reader, mpack_error_bug);
        return count;
    }
    mpack_assert(found != NULL, "found cannot be NULL");

    // the key is only recognized if it is an unsigned int
    if (mpack_peek_tag(reader).type != mpack_type_uint) {
        mpack_discard(reader);
        return count;
    }

    // read the key
    uint64_t value = mpack_expect_u64(reader);
    if (mpack_reader_error(reader) != mpack_ok)
        return count;

    // unrecognized keys are fine, we just return count
    if (value >= count)
        return count;

    // check if this key is a duplicate
    if (found[value]) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return count;
    }

    found[value] = true;
    return (size_t)value;
}